

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O1

bool __thiscall Clasp::ClaspFacade::onModel(ClaspFacade *this,Solver *s,Model *m)

{
  uint64 *puVar1;
  uint64 uVar2;
  SolveStrategy *this_00;
  bool bVar3;
  double dVar4;
  
  dVar4 = RealTime::getTime();
  (this->step_).unsatTime = dVar4;
  uVar2 = (this->step_).numEnum;
  (this->step_).numEnum = uVar2 + 1;
  if (uVar2 == 0) {
    dVar4 = dVar4 - (this->step_).solveTime;
    (this->step_).satTime = (double)(-(ulong)(0.0 <= dVar4) & (ulong)dVar4);
  }
  if ((m->field_0x23 & 4) != 0) {
    puVar1 = &(this->step_).numOptimal;
    *puVar1 = *puVar1 + 1;
  }
  this_00 = *(SolveStrategy **)(((this->solve_).ptr_ & 0xfffffffffffffffe) + 0x10);
  if (this_00 != (SolveStrategy *)0x0) {
    bVar3 = SolveStrategy::setModel(this_00,s,m);
    return bVar3;
  }
  return true;
}

Assistant:

bool ClaspFacade::onModel(const Solver& s, const Model& m) {
	step_.unsatTime = RealTime::getTime();
	if (++step_.numEnum == 1) { step_.satTime = diffTime(step_.unsatTime, step_.solveTime); }
	if (m.opt) { ++step_.numOptimal; }
	return solve_->onModel(s, m);
}